

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

bool __thiscall LTFlightData::CreateAircraft(LTFlightData *this,double simTime)

{
  ulong uVar1;
  recursive_mutex *__mutex;
  _Map_pointer pppVar2;
  _Map_pointer pppVar3;
  _Elt_pointer ppVar4;
  bool bVar5;
  int iVar6;
  positionTy *ppVar7;
  LTAircraft *this_00;
  long lVar8;
  long lVar9;
  ulong uVar10;
  string sPosDeque;
  
  bVar5 = true;
  if (this->pAc == (LTAircraft *)0x0) {
    bVar5 = AcSlotAvailable(this);
    if (bVar5) {
      __mutex = &this->dataAccessMutex;
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      bVar5 = CalcNextPos(this,simTime);
      if (bVar5) {
        while( true ) {
          pppVar2 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node;
          pppVar3 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node;
          ppVar4 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
          if (((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar4 >> 3) *
              -0x71c71c71c71c71c7 +
              ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x71c71c71c71c71c7 +
              (((long)pppVar2 - (long)pppVar3 >> 3) + -1 + (ulong)(pppVar2 == (_Map_pointer)0x0)) *
              7 < 2) break;
          lVar9 = (long)ppVar4 -
                  (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first;
          lVar8 = lVar9 >> 3;
          uVar1 = lVar8 * -0x71c71c71c71c71c7 + 1;
          if (lVar9 < -0x8f) {
            uVar10 = ~((lVar8 * 0x71c71c71c71c71c7 - 2U) / 7);
LAB_0017539e:
            ppVar7 = pppVar3[uVar10] + uVar10 * -7 + uVar1;
          }
          else {
            if (6 < uVar1) {
              uVar10 = uVar1 / 7;
              goto LAB_0017539e;
            }
            ppVar7 = ppVar4 + 1;
          }
          if (simTime < ppVar7->_ts) break;
          std::deque<positionTy,_std::allocator<positionTy>_>::pop_front(&this->posDeque);
        }
        bVar5 = validForAcCreate(this,simTime);
        if (bVar5) {
          positionDeque2String_abi_cxx11_(&sPosDeque,&this->posDeque,(positionTy *)0x0);
          DetermineAcModel(this);
          if (((this->statData).acTypeIcao._M_string_length == 0) && ((int)dataRefs.iLogLevel < 3))
          {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                   ,0xab1,"CreateAircraft",logWARN,
                   "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, can\'t derive type -> will be rendered with standard a/c %s"
                   ,(this->acKey).key._M_dataplus._M_p,(this->statData).man._M_dataplus._M_p,
                   (this->statData).mdl._M_dataplus._M_p,
                   dataRefs.sDefaultAcIcaoType._M_dataplus._M_p);
          }
          this_00 = (LTAircraft *)operator_new(0x958);
          LTAircraft::LTAircraft(this_00,this);
          this->pAc = this_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sPosDeque._M_dataplus._M_p != &sPosDeque.field_2) {
            operator_delete(sPosDeque._M_dataplus._M_p,sPosDeque.field_2._M_allocated_capacity + 1);
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return true;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool LTFlightData::CreateAircraft ( double simTime )
{
    // short-cut if exists already
    if ( hasAc() ) return true;
    
    // exit if too many a/c shown and this one wouldn't be one of the nearest ones
    if (!AcSlotAvailable())
        return false;
    
    try {
        // get the  mutex, not so much for protection,
        // but to speed up creation (which read-accesses lots of data and
        // thus makes many calls to the lock, which are now just quick recursive calls)
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        
        // make sure positional data is up-to-date
        // (also does a last validation...and now with lock, so that state is secured)
        if ( !CalcNextPos(simTime) )
            return false;
        
        // This can have change data in the posDeque...let's see if we are still valid for a/c create
        // Remove outdated positions from posDeque, ie. all positions before simTime
        while (posDeque.size() >= 2 && posDeque[1].ts() <= simTime)
            posDeque.pop_front();
        if ( !validForAcCreate(simTime) )
            return false;
        
        // There are yet unsolved errors where the subsequent aircraft creation failes with an
        // empty posDeque, though we just - while holding the dataAccessMutex - have verified
        // that we are valid for creation. See Issue #174.
        // Next time we see that bug we want to know what NOW is in posDeque:
        const std::string sPosDeque = positionDeque2String(posDeque);
        
        // Make sure we have a valid a/c model now
        DetermineAcModel();
        if (statData.acTypeIcao.empty()) {          // we don't...
            LOG_MSG(logWARN,ERR_NO_AC_TYPE,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    dataRefs.GetDefaultAcIcaoType().c_str());
        }

        // create the object (constructor will recursively re-access the lock)
        try {
            pAc = new LTAircraft(*this);
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_EXCEPTION_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    e.what(), sPosDeque.c_str());
            pAc = nullptr;
        }
        catch(...) {
            LOG_MSG(logERR, ERR_UNKN_EXCP_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    "<?>", sPosDeque.c_str());
            pAc = nullptr;
        }
        if (!pAc)
        {
            LOG_MSG(logERR,ERR_NEW_OBJECT,key().c_str());
            return false;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    // success
    return true;
}